

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> * __thiscall
rcg::Interface::getDevices(Interface *this,uint64_t timeout)

{
  PTLUpdateInterfaceList p_Var1;
  PTLOpenInterface p_Var2;
  ulong uVar3;
  bool bVar4;
  GC_ERROR GVar5;
  int iVar6;
  size_type sVar7;
  element_type *peVar8;
  element_type *peVar9;
  void *pvVar10;
  undefined8 uVar11;
  char *pcVar12;
  pointer pwVar13;
  shared_ptr<rcg::Device> *__r;
  uint64_t in_RDX;
  long in_RSI;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> *in_RDI;
  size_t i_2;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000160;
  string *in_stack_00000168;
  int k;
  size_t size;
  char tmp [256];
  uint32_t i_1;
  uint32_t n;
  GC_ERROR err;
  shared_ptr<rcg::Device> p;
  size_t i;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> current;
  lock_guard<std::mutex> lock;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> *ret;
  Device *in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  pointer pwVar14;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
  *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  allocator *paVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 uVar16;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_fffffffffffffbc0;
  shared_ptr<rcg::Interface> *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  GC_ERROR in_stack_fffffffffffffbd4;
  vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_> local_3b0;
  undefined1 local_391;
  allocator local_369;
  string local_368 [32];
  int local_348;
  undefined1 local_342;
  allocator local_341;
  string local_340 [64];
  size_t local_300;
  char local_2f8 [264];
  uint local_1f0;
  undefined1 local_1ea;
  allocator local_1e9;
  string local_1e8 [64];
  uint32_t local_1a8;
  undefined1 local_1a1;
  allocator local_179;
  string local_178 [134];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [70];
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [64];
  GC_ERROR local_68;
  __shared_ptr local_58 [16];
  ulong local_48;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> local_40;
  undefined1 local_21;
  uint64_t local_18;
  
  local_18 = in_RDX;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffb50,
             (mutex_type *)in_stack_fffffffffffffb48);
  local_21 = 0;
  std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::vector
            ((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> *
             )0x111f88);
  if (*(long *)(in_RSI + 0x80) != 0) {
    std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
    vector((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> *)
           0x111fab);
    for (local_48 = 0; uVar3 = local_48,
        sVar7 = std::
                vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>::
                size((vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
                      *)(in_RSI + 0xa8)), uVar3 < sVar7; local_48 = local_48 + 1) {
      std::vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>::
      operator[]((vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_> *
                 )(in_RSI + 0xa8),local_48);
      std::weak_ptr<rcg::Device>::lock((weak_ptr<rcg::Device> *)in_stack_fffffffffffffb58);
      bVar4 = std::__shared_ptr::operator_cast_to_bool(local_58);
      if (bVar4) {
        std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
        push_back(in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
      }
      std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x11207a);
    }
    peVar8 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1120a4);
    local_68 = (*peVar8->IFUpdateDeviceList)(*(IF_HANDLE *)(in_RSI + 0x80),(bool8_t *)0x0,local_18);
    if (local_68 == -0x3ee) {
      peVar8 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x112101);
      p_Var1 = peVar8->TLUpdateInterfaceList;
      peVar9 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x112121);
      pvVar10 = System::getHandle(peVar9);
      GVar5 = (*p_Var1)(pvVar10,(bool8_t *)0x0,10);
      if (GVar5 != 0) {
        local_aa = 1;
        uVar11 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"Interface::getDevices() (recovery 1) ",&local_a9);
        std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
        GenTLException::GenTLException(_k,in_stack_00000168,in_stack_00000160);
        local_aa = 0;
        __cxa_throw(uVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      peVar8 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1122d1);
      p_Var2 = peVar8->TLOpenInterface;
      peVar9 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1122f1);
      pvVar10 = System::getHandle(peVar9);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      GVar5 = (*p_Var2)(pvVar10,pcVar12,(IF_HANDLE *)(in_RSI + 0x80));
      if (GVar5 != 0) {
        local_f2 = 1;
        uVar11 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,"Interface::getDevices() (recovery 2) ",&local_f1);
        std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
        GenTLException::GenTLException(_k,in_stack_00000168,in_stack_00000160);
        local_f2 = 0;
        __cxa_throw(uVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      peVar8 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x11249f);
      in_stack_fffffffffffffbd4 =
           (*peVar8->IFUpdateDeviceList)(*(IF_HANDLE *)(in_RSI + 0x80),(bool8_t *)0x0,local_18);
      local_68 = in_stack_fffffffffffffbd4;
    }
    if (local_68 != 0) {
      local_1a1 = 1;
      uVar11 = __cxa_allocate_exception(0x28);
      paVar15 = &local_179;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"Interface::getDevices() (1) ",paVar15);
      std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
      std::__cxx11::to_string(in_stack_fffffffffffffb9c);
      std::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      GenTLException::GenTLException(_k,in_stack_00000168,in_stack_00000160);
      local_1a1 = 0;
      __cxa_throw(uVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    local_1a8 = 0;
    peVar8 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1126fa);
    GVar5 = (*peVar8->IFGetNumDevices)(*(IF_HANDLE *)(in_RSI + 0x80),&local_1a8);
    if (GVar5 != 0) {
      local_1ea = 1;
      uVar11 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"Interface::getDevices() (2) ",&local_1e9);
      std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      GenTLException::GenTLException(_k,in_stack_00000168,in_stack_00000160);
      local_1ea = 0;
      __cxa_throw(uVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    uVar16 = 0;
    for (local_1f0 = 0; local_1f0 < local_1a8; local_1f0 = local_1f0 + 1) {
      local_2f8[0xf0] = '\0';
      local_2f8[0xf1] = '\0';
      local_2f8[0xf2] = '\0';
      local_2f8[0xf3] = '\0';
      local_2f8[0xf4] = '\0';
      local_2f8[0xf5] = '\0';
      local_2f8[0xf6] = '\0';
      local_2f8[0xf7] = '\0';
      local_2f8[0xf8] = '\0';
      local_2f8[0xf9] = '\0';
      local_2f8[0xfa] = '\0';
      local_2f8[0xfb] = '\0';
      local_2f8[0xfc] = '\0';
      local_2f8[0xfd] = '\0';
      local_2f8[0xfe] = '\0';
      local_2f8[0xff] = '\0';
      local_2f8[0xe0] = '\0';
      local_2f8[0xe1] = '\0';
      local_2f8[0xe2] = '\0';
      local_2f8[0xe3] = '\0';
      local_2f8[0xe4] = '\0';
      local_2f8[0xe5] = '\0';
      local_2f8[0xe6] = '\0';
      local_2f8[0xe7] = '\0';
      local_2f8[0xe8] = '\0';
      local_2f8[0xe9] = '\0';
      local_2f8[0xea] = '\0';
      local_2f8[0xeb] = '\0';
      local_2f8[0xec] = '\0';
      local_2f8[0xed] = '\0';
      local_2f8[0xee] = '\0';
      local_2f8[0xef] = '\0';
      local_2f8[0xd0] = '\0';
      local_2f8[0xd1] = '\0';
      local_2f8[0xd2] = '\0';
      local_2f8[0xd3] = '\0';
      local_2f8[0xd4] = '\0';
      local_2f8[0xd5] = '\0';
      local_2f8[0xd6] = '\0';
      local_2f8[0xd7] = '\0';
      local_2f8[0xd8] = '\0';
      local_2f8[0xd9] = '\0';
      local_2f8[0xda] = '\0';
      local_2f8[0xdb] = '\0';
      local_2f8[0xdc] = '\0';
      local_2f8[0xdd] = '\0';
      local_2f8[0xde] = '\0';
      local_2f8[0xdf] = '\0';
      local_2f8[0xc0] = '\0';
      local_2f8[0xc1] = '\0';
      local_2f8[0xc2] = '\0';
      local_2f8[0xc3] = '\0';
      local_2f8[0xc4] = '\0';
      local_2f8[0xc5] = '\0';
      local_2f8[0xc6] = '\0';
      local_2f8[199] = '\0';
      local_2f8[200] = '\0';
      local_2f8[0xc9] = '\0';
      local_2f8[0xca] = '\0';
      local_2f8[0xcb] = '\0';
      local_2f8[0xcc] = '\0';
      local_2f8[0xcd] = '\0';
      local_2f8[0xce] = '\0';
      local_2f8[0xcf] = '\0';
      local_2f8[0xb0] = '\0';
      local_2f8[0xb1] = '\0';
      local_2f8[0xb2] = '\0';
      local_2f8[0xb3] = '\0';
      local_2f8[0xb4] = '\0';
      local_2f8[0xb5] = '\0';
      local_2f8[0xb6] = '\0';
      local_2f8[0xb7] = '\0';
      local_2f8[0xb8] = '\0';
      local_2f8[0xb9] = '\0';
      local_2f8[0xba] = '\0';
      local_2f8[0xbb] = '\0';
      local_2f8[0xbc] = '\0';
      local_2f8[0xbd] = '\0';
      local_2f8[0xbe] = '\0';
      local_2f8[0xbf] = '\0';
      local_2f8[0xa0] = '\0';
      local_2f8[0xa1] = '\0';
      local_2f8[0xa2] = '\0';
      local_2f8[0xa3] = '\0';
      local_2f8[0xa4] = '\0';
      local_2f8[0xa5] = '\0';
      local_2f8[0xa6] = '\0';
      local_2f8[0xa7] = '\0';
      local_2f8[0xa8] = '\0';
      local_2f8[0xa9] = '\0';
      local_2f8[0xaa] = '\0';
      local_2f8[0xab] = '\0';
      local_2f8[0xac] = '\0';
      local_2f8[0xad] = '\0';
      local_2f8[0xae] = '\0';
      local_2f8[0xaf] = '\0';
      local_2f8[0x90] = '\0';
      local_2f8[0x91] = '\0';
      local_2f8[0x92] = '\0';
      local_2f8[0x93] = '\0';
      local_2f8[0x94] = '\0';
      local_2f8[0x95] = '\0';
      local_2f8[0x96] = '\0';
      local_2f8[0x97] = '\0';
      local_2f8[0x98] = '\0';
      local_2f8[0x99] = '\0';
      local_2f8[0x9a] = '\0';
      local_2f8[0x9b] = '\0';
      local_2f8[0x9c] = '\0';
      local_2f8[0x9d] = '\0';
      local_2f8[0x9e] = '\0';
      local_2f8[0x9f] = '\0';
      local_2f8[0x80] = '\0';
      local_2f8[0x81] = '\0';
      local_2f8[0x82] = '\0';
      local_2f8[0x83] = '\0';
      local_2f8[0x84] = '\0';
      local_2f8[0x85] = '\0';
      local_2f8[0x86] = '\0';
      local_2f8[0x87] = '\0';
      local_2f8[0x88] = '\0';
      local_2f8[0x89] = '\0';
      local_2f8[0x8a] = '\0';
      local_2f8[0x8b] = '\0';
      local_2f8[0x8c] = '\0';
      local_2f8[0x8d] = '\0';
      local_2f8[0x8e] = '\0';
      local_2f8[0x8f] = '\0';
      local_2f8[0x70] = '\0';
      local_2f8[0x71] = '\0';
      local_2f8[0x72] = '\0';
      local_2f8[0x73] = '\0';
      local_2f8[0x74] = '\0';
      local_2f8[0x75] = '\0';
      local_2f8[0x76] = '\0';
      local_2f8[0x77] = '\0';
      local_2f8[0x78] = '\0';
      local_2f8[0x79] = '\0';
      local_2f8[0x7a] = '\0';
      local_2f8[0x7b] = '\0';
      local_2f8[0x7c] = '\0';
      local_2f8[0x7d] = '\0';
      local_2f8[0x7e] = '\0';
      local_2f8[0x7f] = '\0';
      local_2f8[0x60] = '\0';
      local_2f8[0x61] = '\0';
      local_2f8[0x62] = '\0';
      local_2f8[99] = '\0';
      local_2f8[100] = '\0';
      local_2f8[0x65] = '\0';
      local_2f8[0x66] = '\0';
      local_2f8[0x67] = '\0';
      local_2f8[0x68] = '\0';
      local_2f8[0x69] = '\0';
      local_2f8[0x6a] = '\0';
      local_2f8[0x6b] = '\0';
      local_2f8[0x6c] = '\0';
      local_2f8[0x6d] = '\0';
      local_2f8[0x6e] = '\0';
      local_2f8[0x6f] = '\0';
      local_2f8[0x50] = '\0';
      local_2f8[0x51] = '\0';
      local_2f8[0x52] = '\0';
      local_2f8[0x53] = '\0';
      local_2f8[0x54] = '\0';
      local_2f8[0x55] = '\0';
      local_2f8[0x56] = '\0';
      local_2f8[0x57] = '\0';
      local_2f8[0x58] = '\0';
      local_2f8[0x59] = '\0';
      local_2f8[0x5a] = '\0';
      local_2f8[0x5b] = '\0';
      local_2f8[0x5c] = '\0';
      local_2f8[0x5d] = '\0';
      local_2f8[0x5e] = '\0';
      local_2f8[0x5f] = '\0';
      local_2f8[0x40] = '\0';
      local_2f8[0x41] = '\0';
      local_2f8[0x42] = '\0';
      local_2f8[0x43] = '\0';
      local_2f8[0x44] = '\0';
      local_2f8[0x45] = '\0';
      local_2f8[0x46] = '\0';
      local_2f8[0x47] = '\0';
      local_2f8[0x48] = '\0';
      local_2f8[0x49] = '\0';
      local_2f8[0x4a] = '\0';
      local_2f8[0x4b] = '\0';
      local_2f8[0x4c] = '\0';
      local_2f8[0x4d] = '\0';
      local_2f8[0x4e] = '\0';
      local_2f8[0x4f] = '\0';
      local_2f8[0x30] = '\0';
      local_2f8[0x31] = '\0';
      local_2f8[0x32] = '\0';
      local_2f8[0x33] = '\0';
      local_2f8[0x34] = '\0';
      local_2f8[0x35] = '\0';
      local_2f8[0x36] = '\0';
      local_2f8[0x37] = '\0';
      local_2f8[0x38] = '\0';
      local_2f8[0x39] = '\0';
      local_2f8[0x3a] = '\0';
      local_2f8[0x3b] = '\0';
      local_2f8[0x3c] = '\0';
      local_2f8[0x3d] = '\0';
      local_2f8[0x3e] = '\0';
      local_2f8[0x3f] = '\0';
      local_2f8[0x20] = '\0';
      local_2f8[0x21] = '\0';
      local_2f8[0x22] = '\0';
      local_2f8[0x23] = '\0';
      local_2f8[0x24] = '\0';
      local_2f8[0x25] = '\0';
      local_2f8[0x26] = '\0';
      local_2f8[0x27] = '\0';
      local_2f8[0x28] = '\0';
      local_2f8[0x29] = '\0';
      local_2f8[0x2a] = '\0';
      local_2f8[0x2b] = '\0';
      local_2f8[0x2c] = '\0';
      local_2f8[0x2d] = '\0';
      local_2f8[0x2e] = '\0';
      local_2f8[0x2f] = '\0';
      local_2f8[0x10] = '\0';
      local_2f8[0x11] = '\0';
      local_2f8[0x12] = '\0';
      local_2f8[0x13] = '\0';
      local_2f8[0x14] = '\0';
      local_2f8[0x15] = '\0';
      local_2f8[0x16] = '\0';
      local_2f8[0x17] = '\0';
      local_2f8[0x18] = '\0';
      local_2f8[0x19] = '\0';
      local_2f8[0x1a] = '\0';
      local_2f8[0x1b] = '\0';
      local_2f8[0x1c] = '\0';
      local_2f8[0x1d] = '\0';
      local_2f8[0x1e] = '\0';
      local_2f8[0x1f] = '\0';
      local_2f8[0] = '\0';
      local_2f8[1] = '\0';
      local_2f8[2] = '\0';
      local_2f8[3] = '\0';
      local_2f8[4] = '\0';
      local_2f8[5] = '\0';
      local_2f8[6] = '\0';
      local_2f8[7] = '\0';
      local_2f8[8] = '\0';
      local_2f8[9] = '\0';
      local_2f8[10] = '\0';
      local_2f8[0xb] = '\0';
      local_2f8[0xc] = '\0';
      local_2f8[0xd] = '\0';
      local_2f8[0xe] = '\0';
      local_2f8[0xf] = '\0';
      local_300 = 0x100;
      peVar8 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x11291f);
      GVar5 = (*peVar8->IFGetDeviceID)(*(IF_HANDLE *)(in_RSI + 0x80),local_1f0,local_2f8,&local_300)
      ;
      if (GVar5 != 0) {
        local_342 = 1;
        uVar11 = __cxa_allocate_exception(0x28);
        paVar15 = &local_341;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_340,"Interface::getDevices() (3) ",paVar15);
        std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
        GenTLException::GenTLException(_k,in_stack_00000168,in_stack_00000160);
        local_342 = 0;
        __cxa_throw(uVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,local_2f8,&local_369);
      iVar6 = anon_unknown_5::find
                        ((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                          *)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      local_348 = iVar6;
      if (iVar6 < 0) {
        in_stack_fffffffffffffb60 =
             (vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> *
             )operator_new(0x130);
        local_391 = 1;
        std::enable_shared_from_this<rcg::Interface>::shared_from_this
                  ((enable_shared_from_this<rcg::Interface> *)in_stack_fffffffffffffb48);
        Device::Device((Device *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                       in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                       (char *)CONCAT44(uVar16,in_stack_fffffffffffffbb8));
        local_391 = 0;
        std::shared_ptr<rcg::Device>::shared_ptr<rcg::Device,void>
                  ((shared_ptr<rcg::Device> *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
        push_back((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                   *)in_stack_fffffffffffffb50,(value_type *)in_stack_fffffffffffffb48);
        std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x112c14);
        std::shared_ptr<rcg::Interface>::~shared_ptr((shared_ptr<rcg::Interface> *)0x112c21);
      }
      else {
        std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
        operator[](&local_40,(long)iVar6);
        std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
        push_back(in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
      }
    }
    std::vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>::clear
              ((vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_> *)
               0x112cc4);
    local_3b0.
    super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while (pwVar14 = local_3b0.
                     super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
          pwVar13 = (pointer)std::
                             vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                             ::size(in_RDI), pwVar14 < pwVar13) {
      __r = (shared_ptr<rcg::Device> *)(in_RSI + 0xa8);
      std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
      operator[](in_RDI,(size_type)
                        local_3b0.
                        super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = &local_3b0;
      std::weak_ptr<rcg::Device>::weak_ptr<rcg::Device,void>((weak_ptr<rcg::Device> *)this_00,__r);
      std::vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>::
      push_back(this_00,(value_type *)__r);
      std::weak_ptr<rcg::Device>::~weak_ptr((weak_ptr<rcg::Device> *)0x112d54);
      local_3b0.
      super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&((local_3b0.
                              super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1);
    }
    std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
    ~vector(in_stack_fffffffffffffb60);
  }
  local_21 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x112df4);
  return in_RDI;
}

Assistant:

std::vector<std::shared_ptr<Device> > Interface::getDevices(uint64_t timeout)
{
  std::lock_guard<std::mutex> lock(mtx);

  std::vector<std::shared_ptr<Device> > ret;

  if (ifh != 0)
  {
    // get list of previously requested devices that are still in use

    std::vector<std::shared_ptr<Device> > current;

    for (size_t i=0; i<dlist.size(); i++)
    {
      std::shared_ptr<Device> p=dlist[i].lock();
      if (p)
      {
        current.push_back(p);
      }
    }

    // update available interfaces

    GenTL::GC_ERROR err=gentl->IFUpdateDeviceList(ifh, 0, timeout);

    if (err == GenTL::GC_ERR_INVALID_HANDLE)
    {
      // the interface handle is invalid, try to reopen the interface

      if (gentl->TLUpdateInterfaceList(parent->getHandle(), 0, 10) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException(std::string("Interface::getDevices() (recovery 1) ")+id, gentl);
      }

      if (gentl->TLOpenInterface(parent->getHandle(), id.c_str(), &ifh) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException(std::string("Interface::getDevices() (recovery 2) ")+id, gentl);
      }

      // try to repeat discovery of devices

      err=gentl->IFUpdateDeviceList(ifh, 0, timeout);
    }

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException(std::string("Interface::getDevices() (1) ")+id+" "+std::to_string(err), gentl);
    }

    // create list of devices, using either existing devices or
    // instantiating new ones

    uint32_t n=0;
    if (gentl->IFGetNumDevices(ifh, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException(std::string("Interface::getDevices() (2) ")+id, gentl);
    }

    for (uint32_t i=0; i<n; i++)
    {
      char tmp[256]="";
      size_t size=sizeof(tmp);

      if (gentl->IFGetDeviceID(ifh, i, tmp, &size) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException(std::string("Interface::getDevices() (3) ")+id, gentl);
      }

      int k=find(current, tmp);

      if (k >= 0)
      {
        ret.push_back(current[static_cast<size_t>(k)]);
      }
      else
      {
        ret.push_back(std::shared_ptr<Device>(new Device(shared_from_this(), gentl, tmp)));
      }
    }

    // update internal list of devices for reusage on next call

    dlist.clear();
    for (size_t i=0; i<ret.size(); i++)
    {
      dlist.push_back(ret[i]);
    }
  }

  return ret;
}